

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long PaUtil_ZeroOutput(PaUtilBufferProcessor *bp,unsigned_long frameCount)

{
  PaUtilChannelDescriptor *pPVar1;
  ulong local_30;
  uint local_28;
  uint i;
  uint framesToZero;
  PaUtilChannelDescriptor *hostOutputChannels;
  unsigned_long frameCount_local;
  PaUtilBufferProcessor *bp_local;
  
  pPVar1 = bp->hostOutputChannels[0];
  local_30 = frameCount;
  if (bp->hostOutputFrameCount[0] < frameCount) {
    local_30 = bp->hostOutputFrameCount[0];
  }
  for (local_28 = 0; local_28 < bp->outputChannelCount; local_28 = local_28 + 1) {
    (*bp->outputZeroer)(pPVar1[local_28].data,pPVar1[local_28].stride,(uint)local_30);
    pPVar1[local_28].data =
         (void *)((long)pPVar1[local_28].data +
                 (ulong)((uint)local_30 * pPVar1[local_28].stride * bp->bytesPerHostOutputSample));
  }
  bp->hostOutputFrameCount[0] = (local_30 & 0xffffffff) + bp->hostOutputFrameCount[0];
  return local_30 & 0xffffffff;
}

Assistant:

unsigned long PaUtil_ZeroOutput( PaUtilBufferProcessor* bp, unsigned long frameCount )
{
    PaUtilChannelDescriptor *hostOutputChannels;
    unsigned int framesToZero;
    unsigned int i;

    hostOutputChannels = bp->hostOutputChannels[0];
    framesToZero = PA_MIN_( bp->hostOutputFrameCount[0], frameCount );

    for( i=0; i<bp->outputChannelCount; ++i )
    {
        bp->outputZeroer(   hostOutputChannels[i].data,
                            hostOutputChannels[i].stride,
                            framesToZero );


        /* advance dest ptr for next iteration */
        hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                framesToZero * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
    }

    bp->hostOutputFrameCount[0] += framesToZero;
    
    return framesToZero;
}